

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall
adios2sys::RegularExpression::deep_equal(RegularExpression *this,RegularExpression *rxp)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (this->progsize == rxp->progsize) {
    lVar5 = (long)this->progsize;
    do {
      if (lVar5 == 0) {
        pcVar1 = (this->regmatch).searchstring;
        pcVar2 = (rxp->regmatch).searchstring;
        if ((long)(this->regmatch).startp[0] - (long)pcVar1 !=
            (long)(rxp->regmatch).startp[0] - (long)pcVar2) {
          return false;
        }
        return (long)(this->regmatch).endp[0] - (long)pcVar1 ==
               (long)(rxp->regmatch).endp[0] - (long)pcVar2;
      }
      lVar3 = lVar5 + -1;
      lVar4 = lVar5 + -1;
      lVar5 = lVar5 + -1;
    } while (this->program[lVar3] == rxp->program[lVar4]);
  }
  return false;
}

Assistant:

bool RegularExpression::deep_equal(const RegularExpression& rxp) const
{
  int ind = this->progsize;                     // Get regular expression size
  if (ind != rxp.progsize)                      // If different size regexp
    return false;                               // Return failure
  while (ind-- != 0)                            // Else while still characters
    if (this->program[ind] != rxp.program[ind]) // If regexp are different
      return false;                             // Return failure
  // Else if same start/end ptrs, return true
  return (this->regmatch.start() == rxp.regmatch.start() &&
          this->regmatch.end() == rxp.regmatch.end());
}